

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O2

int xmlBuildURISafe(xmlChar *URI,xmlChar *base,xmlChar **valPtr)

{
  int iVar1;
  uint uVar2;
  xmlChar *pxVar3;
  xmlURIPtr uri;
  xmlChar *pxVar4;
  char *pcVar5;
  xmlChar *cur;
  size_t sVar6;
  long lVar7;
  long lVar8;
  char cVar9;
  xmlURIPtr pxVar10;
  int iVar11;
  long lVar12;
  ulong __n;
  xmlChar *pxVar13;
  xmlURIPtr bas;
  xmlURIPtr ref;
  xmlChar *local_48;
  xmlChar *local_40;
  xmlChar *local_38;
  
  ref = (xmlURIPtr)0x0;
  bas = (xmlURIPtr)0x0;
  if (valPtr == (xmlChar **)0x0) {
    return 1;
  }
  *valPtr = (xmlChar *)0x0;
  if (URI == (xmlChar *)0x0) {
    return 1;
  }
  if (base == (xmlChar *)0x0) {
    pxVar3 = xmlStrdup(URI);
    if (pxVar3 != (xmlChar *)0x0) {
      *valPtr = pxVar3;
      return 0;
    }
    return -1;
  }
  if (*URI == '\0') {
LAB_0014e685:
    pxVar3 = xmlStrstr(base,"://");
    if (pxVar3 == (xmlChar *)0x0) {
      xmlFreeURI(ref);
      *valPtr = (xmlChar *)0x0;
      if (*URI == '\0') {
        if (*base == '\0') {
          return 1;
        }
        pxVar3 = xmlStrdup(base);
        if (pxVar3 != (xmlChar *)0x0) {
          *valPtr = pxVar3;
          return 0;
        }
LAB_0014e801:
        iVar1 = -1;
        pxVar13 = (xmlChar *)0x0;
        pxVar3 = (xmlChar *)0x0;
      }
      else {
        local_38 = xmlStrchr(URI,'#');
        if (local_38 == (xmlChar *)0x0) {
          pxVar3 = (xmlChar *)0x0;
        }
        else {
          URI = xmlStrndup(URI,(int)local_38 - (int)URI);
          pxVar3 = URI;
          if (URI == (xmlChar *)0x0) goto LAB_0014e801;
        }
        iVar1 = -1;
        pxVar4 = (xmlChar *)xmlURIUnescapeString((char *)URI,-1,(char *)0x0);
        pxVar13 = (xmlChar *)0x0;
        if (pxVar4 != (xmlChar *)0x0) {
          local_40 = pxVar3;
          if ((*base == '\0') || (*pxVar4 == '/')) {
            cur = (xmlChar *)0x0;
          }
          else {
            local_48 = pxVar4;
            uVar2 = xmlStrlen(base);
            cur = (xmlChar *)0x0;
            for (; pxVar4 = local_48, 0 < (int)uVar2; uVar2 = uVar2 - 1) {
              __n = (ulong)uVar2;
              if (base[__n - 1] == '/') {
                iVar11 = xmlStrlen(local_48);
                cur = (xmlChar *)(*xmlMalloc)((long)(int)(iVar11 + uVar2 + 1));
                pxVar13 = local_48;
                pxVar3 = local_40;
                if (cur == (xmlChar *)0x0) goto LAB_0014e9a9;
                memcpy(cur,base,__n);
                pxVar4 = local_48;
                memcpy(cur + __n,local_48,(long)(iVar11 + 1));
                break;
              }
            }
            xmlNormalizePath((char *)cur,1);
          }
          pxVar13 = pxVar4;
          if (cur == (xmlChar *)0x0) {
            pxVar13 = (xmlChar *)0x0;
            cur = pxVar4;
          }
          if ((local_38 == (xmlChar *)0x0) ||
             (cur = xmlStrcat(cur,local_38), pxVar3 = local_40, cur != (xmlChar *)0x0)) {
            *valPtr = cur;
            iVar1 = 0;
            pxVar3 = local_40;
          }
        }
      }
LAB_0014e9a9:
      (*xmlFree)(pxVar3);
      (*xmlFree)(pxVar13);
      return iVar1;
    }
    iVar1 = xmlParseURISafe((char *)base,&bas);
    if (iVar1 < 0) goto LAB_0014e78d;
    if (iVar1 == 0) {
      if (ref == (xmlURIPtr)0x0) {
        if (bas->fragment != (char *)0x0) {
          (*xmlFree)(bas->fragment);
          bas->fragment = (char *)0x0;
        }
        pxVar3 = xmlSaveUri(bas);
        goto LAB_0014e83d;
      }
      iVar1 = -1;
      uri = (xmlURIPtr)(*xmlMalloc)(0x58);
      if (uri == (xmlURIPtr)0x0) goto LAB_0014e78d;
      uri->fragment = (char *)0x0;
      *(undefined8 *)&uri->cleanup = 0;
      uri->path = (char *)0x0;
      uri->query = (char *)0x0;
      uri->user = (char *)0x0;
      *(undefined8 *)&uri->port = 0;
      uri->authority = (char *)0x0;
      uri->server = (char *)0x0;
      uri->query_raw = (char *)0x0;
      uri->scheme = (char *)0x0;
      uri->opaque = (char *)0x0;
      pxVar10 = ref;
      if (ref->scheme == (char *)0x0) {
        pxVar10 = uri;
        if ((((ref->path == (char *)0x0) && (ref->authority == (char *)0x0)) &&
            (ref->server == (char *)0x0)) && (ref->port == 0)) {
          if (bas->scheme != (char *)0x0) {
            pcVar5 = (*xmlMemStrdup)(bas->scheme);
            uri->scheme = pcVar5;
            if (pcVar5 == (char *)0x0) goto LAB_0014ed9b;
          }
          if (bas->authority == (char *)0x0) {
            if (bas->server != (char *)0x0) {
              pcVar5 = (*xmlMemStrdup)(bas->server);
              uri->server = pcVar5;
              if (pcVar5 == (char *)0x0) goto LAB_0014ed9b;
            }
            if (bas->user != (char *)0x0) {
              pcVar5 = (*xmlMemStrdup)(bas->user);
              uri->user = pcVar5;
              if (pcVar5 == (char *)0x0) goto LAB_0014ed9b;
            }
            uri->port = bas->port;
LAB_0014eb9d:
            if (bas->path != (char *)0x0) {
              pcVar5 = (*xmlMemStrdup)(bas->path);
              uri->path = pcVar5;
              if (pcVar5 == (char *)0x0) goto LAB_0014ed9b;
            }
            pcVar5 = ref->query_raw;
            if (pcVar5 == (char *)0x0) {
              pcVar5 = ref->query;
              if (pcVar5 != (char *)0x0) {
LAB_0014ed65:
                pcVar5 = (*xmlMemStrdup)(pcVar5);
                uri->query = pcVar5;
                goto LAB_0014ed72;
              }
              pcVar5 = bas->query_raw;
              if (pcVar5 != (char *)0x0) goto LAB_0014ebce;
              pcVar5 = bas->query;
              if (pcVar5 != (char *)0x0) goto LAB_0014ed65;
            }
            else {
LAB_0014ebce:
              pcVar5 = (*xmlMemStrdup)(pcVar5);
              uri->query_raw = pcVar5;
LAB_0014ed72:
              if (pcVar5 == (char *)0x0) goto LAB_0014ed9b;
            }
            if (ref->fragment == (char *)0x0) goto LAB_0014e776;
            pcVar5 = (*xmlMemStrdup)(ref->fragment);
            uri->fragment = pcVar5;
            goto LAB_0014eaa1;
          }
          pcVar5 = (*xmlMemStrdup)(bas->authority);
          uri->authority = pcVar5;
          if (pcVar5 != (char *)0x0) goto LAB_0014eb9d;
        }
        else {
          if (bas->scheme != (char *)0x0) {
            pcVar5 = (*xmlMemStrdup)(bas->scheme);
            uri->scheme = pcVar5;
            if (pcVar5 == (char *)0x0) goto LAB_0014ed9b;
          }
          if (ref->query_raw == (char *)0x0) {
            if (ref->query != (char *)0x0) {
              pcVar5 = (*xmlMemStrdup)(ref->query);
              uri->query = pcVar5;
              goto LAB_0014e9dc;
            }
          }
          else {
            pcVar5 = (*xmlMemStrdup)(ref->query_raw);
            uri->query_raw = pcVar5;
LAB_0014e9dc:
            if (pcVar5 == (char *)0x0) goto LAB_0014ed9b;
          }
          if (ref->fragment != (char *)0x0) {
            pcVar5 = (*xmlMemStrdup)(ref->fragment);
            uri->fragment = pcVar5;
            if (pcVar5 == (char *)0x0) goto LAB_0014ed9b;
          }
          if (ref->authority == (char *)0x0) {
            if (ref->server != (char *)0x0) {
              pcVar5 = (*xmlMemStrdup)(ref->server);
              uri->server = pcVar5;
              if (pcVar5 == (char *)0x0) goto LAB_0014ed9b;
LAB_0014ea60:
              if (ref->user != (char *)0x0) {
                pcVar5 = (*xmlMemStrdup)(ref->user);
                uri->user = pcVar5;
                if (pcVar5 == (char *)0x0) goto LAB_0014ed9b;
              }
              uri->port = ref->port;
              goto LAB_0014ea8b;
            }
            if (ref->port != 0) goto LAB_0014ea60;
            if (bas->authority == (char *)0x0) {
              if (bas->server == (char *)0x0) {
                if (bas->port == 0) goto LAB_0014ec10;
              }
              else {
                pcVar5 = (*xmlMemStrdup)(bas->server);
                uri->server = pcVar5;
                if (pcVar5 == (char *)0x0) goto LAB_0014ed9b;
              }
              if (bas->user != (char *)0x0) {
                pcVar5 = (*xmlMemStrdup)(bas->user);
                uri->user = pcVar5;
                if (pcVar5 == (char *)0x0) goto LAB_0014ed9b;
              }
              uri->port = bas->port;
            }
            else {
              pcVar5 = (*xmlMemStrdup)(bas->authority);
              uri->authority = pcVar5;
              if (pcVar5 == (char *)0x0) goto LAB_0014ed9b;
            }
LAB_0014ec10:
            pcVar5 = ref->path;
            if (pcVar5 == (char *)0x0) {
              iVar11 = 2;
LAB_0014ec39:
              if (bas->path != (char *)0x0) {
                sVar6 = strlen(bas->path);
                iVar11 = iVar11 + (int)sVar6;
              }
              pcVar5 = (char *)(*xmlMalloc)((long)iVar11);
              uri->path = pcVar5;
              pxVar3 = (xmlChar *)0x0;
              iVar11 = 0;
              if (pcVar5 == (char *)0x0) goto LAB_0014e84a;
              *pcVar5 = '\0';
              pcVar5 = bas->path;
              if (pcVar5 != (char *)0x0) {
                lVar7 = 0;
                lVar12 = 0;
                while( true ) {
                  iVar11 = (int)lVar12;
                  lVar7 = (long)(int)lVar7;
                  cVar9 = pcVar5[lVar7];
                  if (cVar9 == '\0') break;
                  lVar8 = lVar7 << 0x20;
                  while( true ) {
                    lVar7 = lVar7 + 1;
                    if (cVar9 == '\0') goto LAB_0014ecdf;
                    if (cVar9 == '/') break;
                    cVar9 = pcVar5[lVar7];
                    lVar8 = lVar8 + 0x100000000;
                  }
                  for (lVar12 = (long)iVar11; lVar12 <= lVar8 >> 0x20; lVar12 = lVar12 + 1) {
                    uri->path[lVar12] = bas->path[lVar12];
                  }
                  pcVar5 = bas->path;
                }
              }
LAB_0014ecdf:
              lVar7 = (long)iVar11;
              uri->path[lVar7] = '\0';
              if ((ref->path != (char *)0x0) && (*ref->path != '\0')) {
                if (iVar11 == 0) {
                  if ((bas->server == (char *)0x0) && (bas->port == 0)) {
                    iVar11 = 0;
                  }
                  else {
                    uri->path[lVar7] = '/';
                    iVar11 = 1;
                  }
                }
                lVar7 = (long)iVar11 << 0x20;
                for (lVar12 = 0; ref->path[lVar12] != '\0'; lVar12 = lVar12 + 1) {
                  uri->path[lVar12 + iVar11] = ref->path[lVar12];
                  lVar7 = lVar7 + 0x100000000;
                }
                lVar7 = lVar7 >> 0x20;
              }
              uri->path[lVar7] = '\0';
              xmlNormalizeURIPath(uri->path);
              goto LAB_0014e776;
            }
            if (*pcVar5 != '/') {
              sVar6 = strlen(pcVar5);
              iVar11 = (int)sVar6 + 2;
              goto LAB_0014ec39;
            }
          }
          else {
            pcVar5 = (*xmlMemStrdup)(ref->authority);
            uri->authority = pcVar5;
            if (pcVar5 == (char *)0x0) goto LAB_0014ed9b;
LAB_0014ea8b:
            pcVar5 = ref->path;
            if (pcVar5 == (char *)0x0) goto LAB_0014e776;
          }
          pcVar5 = (*xmlMemStrdup)(pcVar5);
          uri->path = pcVar5;
LAB_0014eaa1:
          if (pcVar5 != (char *)0x0) goto LAB_0014e776;
        }
LAB_0014ed9b:
        pxVar3 = (xmlChar *)0x0;
        goto LAB_0014e84a;
      }
LAB_0014e776:
      pxVar3 = xmlSaveUri(pxVar10);
    }
    else {
      uri = (xmlURIPtr)0x0;
      if (ref == (xmlURIPtr)0x0) {
        pxVar3 = (xmlChar *)0x0;
        goto LAB_0014e859;
      }
      pxVar3 = xmlSaveUri(ref);
LAB_0014e83d:
      uri = (xmlURIPtr)0x0;
    }
    iVar1 = -(uint)(pxVar3 == (xmlChar *)0x0);
  }
  else {
    iVar1 = xmlParseURISafe((char *)URI,&ref);
    if (iVar1 == 0) {
      if ((ref == (xmlURIPtr)0x0) || (ref->scheme == (char *)0x0)) goto LAB_0014e685;
      pxVar3 = xmlStrdup(URI);
      goto LAB_0014e83d;
    }
LAB_0014e78d:
    pxVar3 = (xmlChar *)0x0;
    uri = (xmlURIPtr)0x0;
  }
LAB_0014e84a:
  if (ref != (xmlURIPtr)0x0) {
    xmlFreeURI(ref);
  }
LAB_0014e859:
  if (bas != (xmlURIPtr)0x0) {
    xmlFreeURI(bas);
  }
  if (uri != (xmlURIPtr)0x0) {
    xmlFreeURI(uri);
  }
  *valPtr = pxVar3;
  return iVar1;
}

Assistant:

int
xmlBuildURISafe(const xmlChar *URI, const xmlChar *base, xmlChar **valPtr) {
    xmlChar *val = NULL;
    int ret, len, indx, cur, out;
    xmlURIPtr ref = NULL;
    xmlURIPtr bas = NULL;
    xmlURIPtr res = NULL;

    if (valPtr == NULL)
        return(1);
    *valPtr = NULL;

    if (URI == NULL)
        return(1);

    if (base == NULL) {
        val = xmlStrdup(URI);
        if (val == NULL)
            return(-1);
        *valPtr = val;
        return(0);
    }

    /*
     * 1) The URI reference is parsed into the potential four components and
     *    fragment identifier, as described in Section 4.3.
     *
     *    NOTE that a completely empty URI is treated by modern browsers
     *    as a reference to "." rather than as a synonym for the current
     *    URI.  Should we do that here?
     */
    if (URI[0] != 0)
        ret = xmlParseURISafe((const char *) URI, &ref);
    else
        ret = 0;
    if (ret != 0)
	goto done;
    if ((ref != NULL) && (ref->scheme != NULL)) {
	/*
	 * The URI is absolute don't modify.
	 */
	val = xmlStrdup(URI);
        if (val == NULL)
            ret = -1;
	goto done;
    }

    /*
     * If base has no scheme or authority, it is assumed to be a
     * filesystem path.
     */
    if (xmlStrstr(base, BAD_CAST "://") == NULL) {
        xmlFreeURI(ref);
        return(xmlResolvePath(URI, base, valPtr));
    }

#if defined(_WIN32) || defined(__CYGWIN__)
    /*
     * Resolve paths with a Windows drive letter as filesystem path
     * even if base has a scheme.
     */
    if ((ref != NULL) && (ref->path != NULL)) {
        int c = ref->path[0];

        if ((((c >= 'A') && (c <= 'Z')) ||
             ((c >= 'a') && (c <= 'z'))) &&
            (ref->path[1] == ':')) {
            xmlFreeURI(ref);
            return(xmlResolvePath(URI, base, valPtr));
        }
    }
#endif

    ret = xmlParseURISafe((const char *) base, &bas);
    if (ret < 0)
        goto done;
    if (ret != 0) {
	if (ref) {
            ret = 0;
	    val = xmlSaveUri(ref);
            if (val == NULL)
                ret = -1;
        }
	goto done;
    }
    if (ref == NULL) {
	/*
	 * the base fragment must be ignored
	 */
	if (bas->fragment != NULL) {
	    xmlFree(bas->fragment);
	    bas->fragment = NULL;
	}
	val = xmlSaveUri(bas);
        if (val == NULL)
            ret = -1;
	goto done;
    }

    /*
     * 2) If the path component is empty and the scheme, authority, and
     *    query components are undefined, then it is a reference to the
     *    current document and we are done.  Otherwise, the reference URI's
     *    query and fragment components are defined as found (or not found)
     *    within the URI reference and not inherited from the base URI.
     *
     *    NOTE that in modern browsers, the parsing differs from the above
     *    in the following aspect:  the query component is allowed to be
     *    defined while still treating this as a reference to the current
     *    document.
     */
    ret = -1;
    res = xmlCreateURI();
    if (res == NULL)
	goto done;
    if ((ref->scheme == NULL) && (ref->path == NULL) &&
	((ref->authority == NULL) && (ref->server == NULL) &&
         (ref->port == PORT_EMPTY))) {
	if (bas->scheme != NULL) {
	    res->scheme = xmlMemStrdup(bas->scheme);
            if (res->scheme == NULL)
                goto done;
        }
	if (bas->authority != NULL) {
	    res->authority = xmlMemStrdup(bas->authority);
            if (res->authority == NULL)
                goto done;
        } else {
	    if (bas->server != NULL) {
		res->server = xmlMemStrdup(bas->server);
                if (res->server == NULL)
                    goto done;
            }
	    if (bas->user != NULL) {
		res->user = xmlMemStrdup(bas->user);
                if (res->user == NULL)
                    goto done;
            }
	    res->port = bas->port;
	}
	if (bas->path != NULL) {
	    res->path = xmlMemStrdup(bas->path);
            if (res->path == NULL)
                goto done;
        }
	if (ref->query_raw != NULL) {
	    res->query_raw = xmlMemStrdup (ref->query_raw);
            if (res->query_raw == NULL)
                goto done;
        } else if (ref->query != NULL) {
	    res->query = xmlMemStrdup(ref->query);
            if (res->query == NULL)
                goto done;
        } else if (bas->query_raw != NULL) {
	    res->query_raw = xmlMemStrdup(bas->query_raw);
            if (res->query_raw == NULL)
                goto done;
        } else if (bas->query != NULL) {
	    res->query = xmlMemStrdup(bas->query);
            if (res->query == NULL)
                goto done;
        }
	if (ref->fragment != NULL) {
	    res->fragment = xmlMemStrdup(ref->fragment);
            if (res->fragment == NULL)
                goto done;
        }
	goto step_7;
    }

    /*
     * 3) If the scheme component is defined, indicating that the reference
     *    starts with a scheme name, then the reference is interpreted as an
     *    absolute URI and we are done.  Otherwise, the reference URI's
     *    scheme is inherited from the base URI's scheme component.
     */
    if (ref->scheme != NULL) {
	val = xmlSaveUri(ref);
        if (val != NULL)
            ret = 0;
	goto done;
    }
    if (bas->scheme != NULL) {
	res->scheme = xmlMemStrdup(bas->scheme);
        if (res->scheme == NULL)
            goto done;
    }

    if (ref->query_raw != NULL) {
	res->query_raw = xmlMemStrdup(ref->query_raw);
        if (res->query_raw == NULL)
            goto done;
    } else if (ref->query != NULL) {
	res->query = xmlMemStrdup(ref->query);
        if (res->query == NULL)
            goto done;
    }
    if (ref->fragment != NULL) {
	res->fragment = xmlMemStrdup(ref->fragment);
        if (res->fragment == NULL)
            goto done;
    }

    /*
     * 4) If the authority component is defined, then the reference is a
     *    network-path and we skip to step 7.  Otherwise, the reference
     *    URI's authority is inherited from the base URI's authority
     *    component, which will also be undefined if the URI scheme does not
     *    use an authority component.
     */
    if ((ref->authority != NULL) || (ref->server != NULL) ||
         (ref->port != PORT_EMPTY)) {
	if (ref->authority != NULL) {
	    res->authority = xmlMemStrdup(ref->authority);
            if (res->authority == NULL)
                goto done;
        } else {
            if (ref->server != NULL) {
                res->server = xmlMemStrdup(ref->server);
                if (res->server == NULL)
                    goto done;
            }
	    if (ref->user != NULL) {
		res->user = xmlMemStrdup(ref->user);
                if (res->user == NULL)
                    goto done;
            }
            res->port = ref->port;
	}
	if (ref->path != NULL) {
	    res->path = xmlMemStrdup(ref->path);
            if (res->path == NULL)
                goto done;
        }
	goto step_7;
    }
    if (bas->authority != NULL) {
	res->authority = xmlMemStrdup(bas->authority);
        if (res->authority == NULL)
            goto done;
    } else if ((bas->server != NULL) || (bas->port != PORT_EMPTY)) {
	if (bas->server != NULL) {
	    res->server = xmlMemStrdup(bas->server);
            if (res->server == NULL)
                goto done;
        }
	if (bas->user != NULL) {
	    res->user = xmlMemStrdup(bas->user);
            if (res->user == NULL)
                goto done;
        }
	res->port = bas->port;
    }

    /*
     * 5) If the path component begins with a slash character ("/"), then
     *    the reference is an absolute-path and we skip to step 7.
     */
    if ((ref->path != NULL) && (ref->path[0] == '/')) {
	res->path = xmlMemStrdup(ref->path);
        if (res->path == NULL)
            goto done;
	goto step_7;
    }


    /*
     * 6) If this step is reached, then we are resolving a relative-path
     *    reference.  The relative path needs to be merged with the base
     *    URI's path.  Although there are many ways to do this, we will
     *    describe a simple method using a separate string buffer.
     *
     * Allocate a buffer large enough for the result string.
     */
    len = 2; /* extra / and 0 */
    if (ref->path != NULL)
	len += strlen(ref->path);
    if (bas->path != NULL)
	len += strlen(bas->path);
    res->path = xmlMalloc(len);
    if (res->path == NULL)
	goto done;
    res->path[0] = 0;

    /*
     * a) All but the last segment of the base URI's path component is
     *    copied to the buffer.  In other words, any characters after the
     *    last (right-most) slash character, if any, are excluded.
     */
    cur = 0;
    out = 0;
    if (bas->path != NULL) {
	while (bas->path[cur] != 0) {
	    while ((bas->path[cur] != 0) && (bas->path[cur] != '/'))
		cur++;
	    if (bas->path[cur] == 0)
		break;

	    cur++;
	    while (out < cur) {
		res->path[out] = bas->path[out];
		out++;
	    }
	}
    }
    res->path[out] = 0;

    /*
     * b) The reference's path component is appended to the buffer
     *    string.
     */
    if (ref->path != NULL && ref->path[0] != 0) {
	indx = 0;
	/*
	 * Ensure the path includes a '/'
	 */
	if ((out == 0) && ((bas->server != NULL) || bas->port != PORT_EMPTY))
	    res->path[out++] = '/';
	while (ref->path[indx] != 0) {
	    res->path[out++] = ref->path[indx++];
	}
    }
    res->path[out] = 0;

    /*
     * Steps c) to h) are really path normalization steps
     */
    xmlNormalizeURIPath(res->path);

step_7:

    /*
     * 7) The resulting URI components, including any inherited from the
     *    base URI, are recombined to give the absolute form of the URI
     *    reference.
     */
    val = xmlSaveUri(res);
    if (val != NULL)
        ret = 0;

done:
    if (ref != NULL)
	xmlFreeURI(ref);
    if (bas != NULL)
	xmlFreeURI(bas);
    if (res != NULL)
	xmlFreeURI(res);
    *valPtr = val;
    return(ret);
}